

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_opt.c
# Opt level: O2

int yo_opt_update_data_in_format(char *arg,yl_opt *yo)

{
  LYD_FORMAT LVar1;
  int iVar2;
  
  iVar2 = strcasecmp(arg,"xml");
  if (iVar2 == 0) {
    LVar1 = LYD_XML;
  }
  else {
    iVar2 = strcasecmp(arg,"json");
    if (iVar2 == 0) {
      LVar1 = LYD_JSON;
    }
    else {
      iVar2 = strcasecmp(arg,"lyb");
      if (iVar2 != 0) {
        return 1;
      }
      LVar1 = LYD_LYB;
    }
  }
  yo->data_in_format = LVar1;
  return 0;
}

Assistant:

int
yo_opt_update_data_in_format(const char *arg, struct yl_opt *yo)
{
    if (!strcasecmp(arg, "xml")) {
        yo->data_in_format = LYD_XML;
    } else if (!strcasecmp(arg, "json")) {
        yo->data_in_format = LYD_JSON;
    } else if (!strcasecmp(arg, "lyb")) {
        yo->data_in_format = LYD_LYB;
    } else {
        return 1;
    }

    return 0;
}